

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIMultiplayer.cpp
# Opt level: O0

void XPMP2::AIMultiClearTcasDataRefs(void)

{
  long lVar1;
  int *piVar2;
  vector<int,_std::allocator<int>_> nullArr;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  if (drTcasModeS != 0) {
    uVar3 = 0;
    __a = (allocator_type *)&stack0xffffffffffffffe3;
    std::allocator<int>::allocator((allocator<int> *)0x322605);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,(value_type_conflict4 *)in_stack_ffffffffffffffd0,__a);
    std::allocator<int>::~allocator((allocator<int> *)0x32262a);
    lVar1 = drTcasModeS;
    piVar2 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x32263f);
    XPLMSetDatavi(lVar1,piVar2,1,(undefined4)numSlots);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

void AIMultiClearTcasDataRefs ()
{
    if (drTcasModeS) {
        std::vector<int> nullArr (numSlots, 0);
        XPLMSetDatavi(drTcasModeS, nullArr.data(), 1, (int)numSlots);
    }
}